

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

void NdGetVersion(ND_UINT32 *Major,ND_UINT32 *Minor,ND_UINT32 *Revision,char **BuildDate,
                 char **BuildTime)

{
  char **BuildTime_local;
  char **BuildDate_local;
  ND_UINT32 *Revision_local;
  ND_UINT32 *Minor_local;
  ND_UINT32 *Major_local;
  
  if (Major != (ND_UINT32 *)0x0) {
    *Major = 2;
  }
  if (Minor != (ND_UINT32 *)0x0) {
    *Minor = 3;
  }
  if (Revision != (ND_UINT32 *)0x0) {
    *Revision = 0;
  }
  if (BuildDate != (char **)0x0) {
    *BuildDate = "Apr 25 2025";
  }
  if (BuildTime != (char **)0x0) {
    *BuildTime = "21:50:06";
  }
  return;
}

Assistant:

void
NdGetVersion(
    ND_UINT32 *Major,
    ND_UINT32 *Minor,
    ND_UINT32 *Revision,
    const char **BuildDate,
    const char **BuildTime
    )
{
    if (ND_NULL != Major)
    {
        *Major = DISASM_VERSION_MAJOR;
    }

    if (ND_NULL != Minor)
    {
        *Minor = DISASM_VERSION_MINOR;
    }

    if (ND_NULL != Revision)
    {
        *Revision = DISASM_VERSION_REVISION;
    }

//
// Do not use __TIME__ and __DATE__ macros when compiling against a kernel tree.
//
#if defined(__KERNEL__)

    if (ND_NULL != BuildDate)
    {
        *BuildDate = (char *)ND_NULL;
    }

    if (ND_NULL != BuildTime)
    {
        *BuildTime = (char *)ND_NULL;
    }

#else

    if (ND_NULL != BuildDate)
    {
        *BuildDate = __DATE__;
    }

    if (ND_NULL != BuildTime)
    {
        *BuildTime = __TIME__;
    }

#endif

}